

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  undefined4 extraout_EAX;
  uint uVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  char *pcVar7;
  char *label_00;
  char *pcVar8;
  int column_n;
  int n;
  undefined4 uVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  ImVector<ImGuiColumnData> *this;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  ImDrawList *draw_list;
  undefined1 auVar19 [16];
  
  if (window->Active == false) {
    uVar11 = (ulong)window->WasActive;
  }
  else {
    uVar11 = 1;
  }
  bVar3 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar11,window);
  if (!bVar3) {
    return;
  }
  uVar4 = window->Flags;
  draw_list = window->DrawList;
  NodeDrawList(window,draw_list,label_00);
  uVar9 = SUB84(draw_list,0);
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)",(double)(window->Pos).x
             ,(double)(window->Pos).y,(double)(window->Size).x,(double)(window->Size).y,
             (double)(window->SizeContents).x,(double)(window->SizeContents).y);
  pcVar8 = "Child ";
  if ((uVar4 >> 0x18 & 1) == 0) {
    pcVar8 = "";
  }
  pcVar7 = "Tooltip ";
  if ((uVar4 >> 0x19 & 1) == 0) {
    pcVar7 = "";
  }
  auVar18._0_4_ = -(uint)((uVar4 & 0x100) == 0);
  auVar18._4_4_ = -(uint)((uVar4 & 0x10000000) == 0);
  auVar18._8_4_ = -(uint)((uVar4 & 0x8000000) == 0);
  auVar18._12_4_ = -(uint)((uVar4 & 0x4000000) == 0);
  uVar10 = movmskps(uVar9,auVar18);
  pcVar12 = "Popup ";
  if ((uVar10 & 8) != 0) {
    pcVar12 = "";
  }
  pcVar13 = "Modal ";
  if ((uVar10 & 4) != 0) {
    pcVar13 = "";
  }
  pcVar14 = "ChildMenu ";
  if ((uVar10 & 2) != 0) {
    pcVar14 = "";
  }
  pcVar15 = "NoSavedSettings ";
  if ((uVar10 & 1) != 0) {
    pcVar15 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)",(ulong)uVar4,pcVar8,pcVar7,pcVar12,pcVar13,pcVar14,
             pcVar15);
  fVar23 = (window->SizeContents).x - ((window->SizeFull).x - (window->ScrollbarSizes).x);
  fVar24 = (window->SizeContents).y - ((window->SizeFull).y - (window->ScrollbarSizes).y);
  iVar16 = -(uint)(fVar23 <= 0.0);
  iVar17 = -(uint)(fVar24 <= 0.0);
  auVar20._4_4_ = iVar17;
  auVar20._0_4_ = iVar16;
  auVar20._8_4_ = iVar17;
  auVar20._12_4_ = iVar17;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._4_4_ = iVar16;
  auVar19._0_4_ = iVar16;
  uVar4 = movmskpd(extraout_EAX,auVar19);
  dVar22 = 0.0;
  dVar21 = 0.0;
  if ((uVar4 & 1) == 0) {
    dVar21 = (double)fVar23;
  }
  if ((uVar4 & 2) == 0) {
    dVar22 = (double)fVar24;
  }
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)(window->Scroll).x,dVar21,
             (double)(window->Scroll).y,dVar22);
  BulletText("Active: %d, WriteAccessed: %d",(ulong)window->Active,(ulong)window->WriteAccessed);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar8 = "NULL";
  }
  else {
    pcVar8 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar8);
  fVar23 = window->NavRectRel[0].Min.x;
  fVar24 = window->NavRectRel[0].Max.x;
  if (fVar23 <= fVar24) {
    fVar1 = window->NavRectRel[0].Min.y;
    fVar2 = window->NavRectRel[0].Max.y;
    if (fVar1 <= fVar2) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar23,(double)fVar1,(double)fVar24
                 ,(double)fVar2);
      goto LAB_001924c6;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_001924c6:
  if (window->RootWindow != window) {
    NodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    NodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
  }
  if (0 < (window->ColumnsStorage).Size) {
    bVar3 = TreeNode("Columns","Columns sets (%d)");
    if (bVar3) {
      for (iVar16 = 0; iVar16 < (window->ColumnsStorage).Size; iVar16 = iVar16 + 1) {
        pvVar5 = ImVector<ImGuiColumnsSet>::operator[](&window->ColumnsStorage,iVar16);
        bVar3 = TreeNode((void *)(ulong)pvVar5->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                         (void *)(ulong)pvVar5->ID,(ulong)(uint)pvVar5->Count,
                         (ulong)(uint)pvVar5->Flags);
        if (bVar3) {
          BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",(double)(pvVar5->MaxX - pvVar5->MinX),
                     (double)pvVar5->MinX,(double)pvVar5->MaxX);
          this = &pvVar5->Columns;
          for (uVar4 = 0; (int)uVar4 < this->Size; uVar4 = uVar4 + 1) {
            pvVar6 = ImVector<ImGuiColumnData>::operator[](this,uVar4);
            fVar23 = pvVar6->OffsetNorm;
            pvVar6 = ImVector<ImGuiColumnData>::operator[](this,uVar4);
            BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar23,
                       (double)((pvVar5->MaxX - pvVar5->MinX) * pvVar6->OffsetNorm),(ulong)uVar4);
          }
          TreePop();
        }
      }
      TreePop();
    }
  }
  BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
  TreePop();
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
            {
                if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                    return;
                ImGuiWindowFlags flags = window->Flags;
                NodeDrawList(window, window->DrawList, "DrawList");
                ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
                ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)", flags,
                    (flags & ImGuiWindowFlags_ChildWindow) ? "Child " : "", (flags & ImGuiWindowFlags_Tooltip)   ? "Tooltip "   : "", (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                    (flags & ImGuiWindowFlags_Modal)       ? "Modal " : "", (flags & ImGuiWindowFlags_ChildMenu) ? "ChildMenu " : "", (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "");
                ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetScrollMaxX(window), window->Scroll.y, GetScrollMaxY(window));
                ImGui::BulletText("Active: %d, WriteAccessed: %d", window->Active, window->WriteAccessed);
                ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
                ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
                if (!window->NavRectRel[0].IsInverted())
                    ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
                else
                    ImGui::BulletText("NavRectRel[0]: <None>");
                if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
                if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
                if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
                if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
                {
                    for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    {
                        const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                        if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                        {
                            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
                ImGui::TreePop();
            }